

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp_sample.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int local_10;
  int result;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    local_10 = 0;
    printf("\r\nSending HTTP GET\r\n\r\n");
    test_http_get();
    printf("\r\nSending HTTP POST\r\n\r\n");
    test_http_post();
    platform_deinit();
  }
  else {
    printf("platform_init\r\n");
    local_10 = 0xc1;
  }
  printf("Press any key to continue:");
  getchar();
  return local_10;
}

Assistant:

int main(void)
{
    int result;

    if (platform_init() != 0)
    {
        (void)printf("platform_init\r\n");
        result = __LINE__;
    }
    else
    {
        result = 0;

        (void)printf("\r\nSending HTTP GET\r\n\r\n");
        test_http_get();

        (void)printf("\r\nSending HTTP POST\r\n\r\n");
        test_http_post();

        platform_deinit();
    }

    (void)printf("Press any key to continue:");
    (void)getchar();
    return result;
}